

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O3

double __thiscall RandomGen::FindNewMean(RandomGen *this,double sigma)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = -1.0 / sigma;
  dVar1 = exp(dVar3 * -0.5 * dVar3);
  dVar2 = gcem::internal::sqrt_check<double>(6.283185307179586,1.0);
  dVar3 = erf(dVar3 / 1.414213562373095);
  return ((dVar1 / dVar2) / ((dVar3 + 1.0) * -0.5 + 1.0)) * sigma + 1.0;
}

Assistant:

double RandomGen::FindNewMean(double sigma) {
  // Follow https://en.wikipedia.org/wiki/Truncated_normal_distribution
  double TruncGaussAlpha = -1. / sigma;
  double LittlePhi_Alpha =
      exp(-0.5 * TruncGaussAlpha * TruncGaussAlpha) / gcem::sqrt(2. * M_PI);
  double BigPhi_Alpha = 0.5 * (1. + erf(TruncGaussAlpha / sqrt2));
  return 1. + (LittlePhi_Alpha / (1. - BigPhi_Alpha)) * sigma;
}